

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O2

void log_event(int event,void *ptr,size_t size)

{
  bool bVar1;
  _Rb_tree_color _Var2;
  int callstack_depth;
  mapped_type *__dest;
  iterator iVar3;
  FILE *__stream;
  void *ptr_local;
  hu_allocinfo_t allocinfo;
  
  if (logging_enabled != 0) {
    ptr_local = ptr;
    if (event == 2) {
      iVar3 = std::
              _Rb_tree<void_*,_std::pair<void_*const,_hu_allocinfo_s>,_std::_Select1st<std::pair<void_*const,_hu_allocinfo_s>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
              ::find(&allocations->_M_t,&ptr_local);
      if ((_Rb_tree_header *)iVar3._M_node == &(allocations->_M_t)._M_impl.super__Rb_tree_header) {
        if (hu_log_free != 0) {
          iVar3 = std::
                  _Rb_tree<void_*,_std::pair<void_*const,_hu_allocinfo_s>,_std::_Select1st<std::pair<void_*const,_hu_allocinfo_s>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
                  ::find(&freed_allocations->_M_t,&ptr_local);
          if ((_Rb_tree_header *)iVar3._M_node !=
              &(freed_allocations->_M_t)._M_impl.super__Rb_tree_header) {
            callstack_depth = backtrace(&allocinfo,0x14);
            bVar1 = log_is_valid_callstack(callstack_depth,&allocinfo.ptr,false);
            if (bVar1) {
              __stream = fopen(hu_log_file,"a");
              if (__stream != (FILE *)0x0) {
                fprintf(__stream,"==%d== Invalid deallocation at:\n",(ulong)(uint)pid);
                log_print_callstack((FILE *)__stream,callstack_depth,&allocinfo.ptr);
                fprintf(__stream,"==%d==  Address %p is a block of size %ld free\'d at:\n",
                        (ulong)(uint)pid,ptr_local,iVar3._M_node[1]._M_left);
                log_print_callstack((FILE *)__stream,iVar3._M_node[0xc]._M_color,
                                    (void **)(iVar3._M_node + 7));
                fprintf(__stream,"==%d==  Block was alloc\'d at:\n",(ulong)(uint)pid);
                log_print_callstack((FILE *)__stream,*(int *)&iVar3._M_node[6]._M_right,
                                    &iVar3._M_node[1]._M_right);
                fprintf(__stream,"==%d== \n",(ulong)(uint)pid);
                fclose(__stream);
              }
            }
          }
        }
      }
      else {
        allocinfo_current_alloc_bytes =
             allocinfo_current_alloc_bytes - (long)iVar3._M_node[1]._M_left;
        if ((hu_useafterfree != false) || (hu_log_free != 0)) {
          _Var2 = backtrace(iVar3._M_node + 7,0x14);
          iVar3._M_node[0xc]._M_color = _Var2;
          std::
          _Rb_tree<void*,std::pair<void*const,hu_allocinfo_s>,std::_Select1st<std::pair<void*const,hu_allocinfo_s>>,std::less<void*>,std::allocator<std::pair<void*const,hu_allocinfo_s>>>
          ::_M_emplace_unique<std::pair<void*const,hu_allocinfo_s>&>
                    ((_Rb_tree<void*,std::pair<void*const,hu_allocinfo_s>,std::_Select1st<std::pair<void*const,hu_allocinfo_s>>,std::less<void*>,std::allocator<std::pair<void*const,hu_allocinfo_s>>>
                      *)freed_allocations,(pair<void_*const,_hu_allocinfo_s> *)(iVar3._M_node + 1));
        }
        std::
        _Rb_tree<void_*,_std::pair<void_*const,_hu_allocinfo_s>,_std::_Select1st<std::pair<void_*const,_hu_allocinfo_s>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
        ::erase(&allocations->_M_t,&ptr_local);
      }
      allocinfo_total_frees = allocinfo_total_frees + 1;
    }
    else if (event == 1) {
      if (hu_log_free != 0) {
        std::
        _Rb_tree<void_*,_std::pair<void_*const,_hu_allocinfo_s>,_std::_Select1st<std::pair<void_*const,_hu_allocinfo_s>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
        ::erase(&freed_allocations->_M_t,&ptr_local);
      }
      if (hu_log_minleak <= size) {
        allocinfo.ptr = ptr_local;
        allocinfo.size = size;
        allocinfo.callstack_depth = backtrace(allocinfo.callstack,0x14);
        allocinfo.count = 1;
        __dest = std::
                 map<void_*,_hu_allocinfo_s,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
                 ::operator[](allocations,&ptr_local);
        memcpy(__dest,&allocinfo,0x160);
        allocinfo_total_allocs = allocinfo_total_allocs + 1;
        allocinfo_total_alloc_bytes = allocinfo_total_alloc_bytes + size;
        allocinfo_current_alloc_bytes = size + allocinfo_current_alloc_bytes;
        if (allocinfo_peak_alloc_bytes < allocinfo_current_alloc_bytes) {
          allocinfo_peak_alloc_bytes = allocinfo_current_alloc_bytes;
        }
      }
    }
  }
  return;
}

Assistant:

void log_event(int event, void *ptr, size_t size)
{
  if (logging_enabled)
  {
    if (event == EVENT_MALLOC)
    {
      if (hu_log_free)
      {
        freed_allocations->erase(ptr);
      }
      
      if (size >= hu_log_minleak)
      {
        hu_allocinfo_t allocinfo;
        allocinfo.size = size;
        allocinfo.ptr = ptr;
        allocinfo.callstack_depth = backtrace(allocinfo.callstack, MAX_CALL_STACK);
        allocinfo.count = 1;
        (*allocations)[ptr] = allocinfo;
        
        allocinfo_total_allocs += 1;
        allocinfo_total_alloc_bytes += size;
        allocinfo_current_alloc_bytes += size;

        if (allocinfo_current_alloc_bytes > allocinfo_peak_alloc_bytes)
        {
          allocinfo_peak_alloc_bytes = allocinfo_current_alloc_bytes;
        }
      }
    }
      else if (event == EVENT_FREE)
      {
        std::map<void*, hu_allocinfo_t>::iterator allocation = allocations->find(ptr);
        if (allocation != allocations->end())
        {
          allocinfo_current_alloc_bytes -= allocation->second.size;

          if (hu_useafterfree || hu_log_free)
          {
            allocation->second.free_callstack_depth =
              backtrace(allocation->second.free_callstack, MAX_CALL_STACK);
            freed_allocations->insert(*allocation);
          }
          
          allocations->erase(ptr);
        }
        else if (hu_log_free)
        {
          allocation = freed_allocations->find(ptr);
          if (allocation != freed_allocations->end())
          {
            void *callstack[MAX_CALL_STACK];
            int callstack_depth = backtrace(callstack, MAX_CALL_STACK);
            if (log_is_valid_callstack(callstack_depth, callstack, false))
            {
              FILE *f = fopen(hu_log_file, "a");
              if (f)
              {
                fprintf(f, "==%d== Invalid deallocation at:\n", pid);

                log_print_callstack(f, callstack_depth, callstack);

                fprintf(f, "==%d==  Address %p is a block of size %ld free'd at:\n",
                        pid, ptr, allocation->second.size);
          
                log_print_callstack(f, allocation->second.free_callstack_depth,
                                    allocation->second.free_callstack);

                fprintf(f, "==%d==  Block was alloc'd at:\n", pid);
          
                log_print_callstack(f, allocation->second.callstack_depth,
                                    allocation->second.callstack);

                fprintf(f, "==%d== \n", pid);

                fclose(f);
              }
            }
          }
        }

        allocinfo_total_frees += 1;
      }

  }
}